

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

uint64_t __thiscall
leveldb::VersionSet::ApproximateOffsetOf(VersionSet *this,Version *v,InternalKey *ikey)

{
  pointer ppFVar1;
  FileMetaData *pFVar2;
  Table *this_00;
  int iVar3;
  Iterator *pIVar4;
  uint64_t uVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar8;
  Table *tableptr;
  uint64_t local_68;
  ReadOptions local_60;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_50;
  VersionSet *local_48;
  long local_40;
  Table *local_38;
  
  local_50 = v->files_;
  lVar6 = 0;
  local_68 = 0;
  local_48 = this;
  do {
    if (lVar6 == 7) {
      return local_68;
    }
    pvVar8 = local_50 + lVar6;
    uVar7 = 0;
    local_40 = lVar6;
    while( true ) {
      ppFVar1 = (pvVar8->
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pvVar8->
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar7)
      break;
      iVar3 = InternalKeyComparator::Compare(&this->icmp_,&ppFVar1[uVar7]->largest,ikey);
      pFVar2 = (pvVar8->
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar7];
      if (iVar3 < 1) {
        local_68 = local_68 + pFVar2->file_size;
      }
      else {
        iVar3 = InternalKeyComparator::Compare(&this->icmp_,&pFVar2->smallest,ikey);
        if (iVar3 < 1) {
          local_60 = (ReadOptions)ZEXT216(0x100);
          pFVar2 = (pvVar8->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar7];
          pIVar4 = TableCache::NewIterator
                             (local_48->table_cache_,&local_60,pFVar2->number,pFVar2->file_size,
                              &local_38);
          this_00 = local_38;
          if (local_38 != (Table *)0x0) {
            local_60 = (ReadOptions)InternalKey::Encode(ikey);
            uVar5 = Table::ApproximateOffsetOf(this_00,(Slice *)&local_60);
            local_68 = local_68 + uVar5;
          }
          lVar6 = local_40;
          if (pIVar4 != (Iterator *)0x0) {
            (*pIVar4->_vptr_Iterator[1])(pIVar4);
          }
        }
        else if (lVar6 != 0) break;
      }
      uVar7 = uVar7 + 1;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

uint64_t VersionSet::ApproximateOffsetOf(Version* v, const InternalKey& ikey) {
  uint64_t result = 0;
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = v->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      if (icmp_.Compare(files[i]->largest, ikey) <= 0) {
        // Entire file is before "ikey", so just add the file size
        result += files[i]->file_size;
      } else if (icmp_.Compare(files[i]->smallest, ikey) > 0) {
        // Entire file is after "ikey", so ignore
        if (level > 0) {
          // Files other than level 0 are sorted by meta->smallest, so
          // no further files in this level will contain data for
          // "ikey".
          break;
        }
      } else {
        // "ikey" falls in the range for this table.  Add the
        // approximate offset of "ikey" within the table.
        Table* tableptr;
        Iterator* iter = table_cache_->NewIterator(
            ReadOptions(), files[i]->number, files[i]->file_size, &tableptr);
        if (tableptr != nullptr) {
          result += tableptr->ApproximateOffsetOf(ikey.Encode());
        }
        delete iter;
      }
    }
  }
  return result;
}